

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O1

void __thiscall TasGrid::GridSequence::loadConstructedPoints(GridSequence *this)

{
  MultiIndexSet *current;
  ulong uVar1;
  ulong uVar2;
  _Fwd_list_impl _Var3;
  vector<double,_std::allocator<double>_> vals;
  MultiIndexSet new_points;
  undefined1 local_90 [16];
  pointer local_80;
  pointer local_70;
  MultiIndexSet local_68;
  undefined1 local_40 [16];
  pointer piStack_30;
  pointer local_28;
  pointer piStack_20;
  
  local_40._0_8_ = SEXT48((this->super_BaseCanonicalGrid).num_dimensions);
  local_40._8_8_ = 0;
  piStack_30 = (pointer)0x0;
  local_28 = (pointer)0x0;
  piStack_20 = (pointer)0x0;
  _Var3._M_head._M_next =
       (((this->dynamic_values)._M_t.
         super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
         ._M_t.
         super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
         .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl)->data).
       super__Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>._M_impl._M_head;
  if (_Var3._M_head._M_next != (_Fwd_list_node_base)0x0) {
    do {
      ::std::vector<int,std::allocator<int>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                ((vector<int,std::allocator<int>> *)&piStack_30,local_28,
                 *(long *)((long)_Var3._M_head._M_next + 8),
                 *(long *)((long)_Var3._M_head._M_next + 8) + local_40._0_8_ * 4);
      local_40._8_8_ = local_40._8_8_ + 1;
      _Var3._M_head._M_next = *(_Fwd_list_node_base *)_Var3._M_head._M_next;
    } while (_Var3._M_head._M_next != (_Fwd_list_node_base *)0x0);
  }
  MultiIndexSet::MultiIndexSet((MultiIndexSet *)local_90,(Data2D<int> *)local_40);
  current = &(this->super_BaseCanonicalGrid).points;
  MultiIndexManipulations::getLargestCompletion(&local_68,current,(MultiIndexSet *)local_90);
  if (local_80 != (pointer)0x0) {
    operator_delete(local_80,(long)local_70 - (long)local_80);
  }
  if (local_68.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start !=
      local_68.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish) {
    clearGpuNodes(this);
    clearGpuSurpluses(this);
    SimpleConstructData::extractValues
              ((vector<double,_std::allocator<double>_> *)local_90,
               (this->dynamic_values)._M_t.
               super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
               ._M_t.
               super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
               .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl,&local_68)
    ;
    if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      (this->super_BaseCanonicalGrid).points.cache_num_indexes = local_68.cache_num_indexes;
      current->num_dimensions = local_68.num_dimensions;
      ::std::vector<int,_std::allocator<int>_>::operator=
                (&(this->super_BaseCanonicalGrid).points.indexes,&local_68.indexes);
      uVar2 = (long)(local_90._8_8_ - local_90._0_8_) >> 3;
      uVar1 = (this->super_BaseCanonicalGrid).values.num_outputs;
      (this->super_BaseCanonicalGrid).values.num_values = uVar2 / uVar1;
      ::std::vector<double,_std::allocator<double>_>::_M_move_assign
                (&(this->super_BaseCanonicalGrid).values.values,local_90,uVar2 % uVar1);
    }
    else {
      StorageSet::addValues
                (&(this->super_BaseCanonicalGrid).values,current,&local_68,(double *)local_90._0_8_)
      ;
      current->num_dimensions = local_68.num_dimensions;
      MultiIndexSet::addSortedIndexes(current,&local_68.indexes);
    }
    prepareSequence(this,0);
    recomputeSurpluses(this);
    if ((double *)local_90._0_8_ != (double *)0x0) {
      operator_delete((void *)local_90._0_8_,(long)local_80 - local_90._0_8_);
    }
  }
  if (local_68.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_68.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (piStack_30 != (pointer)0x0) {
    operator_delete(piStack_30,(long)piStack_20 - (long)piStack_30);
  }
  return;
}

Assistant:

void GridSequence::loadConstructedPoints(){
    Data2D<int> candidates(num_dimensions, 0);
    for(auto &d : dynamic_values->data)
        candidates.appendStrip(d.point);
    auto new_points = MultiIndexManipulations::getLargestCompletion(points, MultiIndexSet(candidates));
    if (new_points.empty()) return;

    clearGpuNodes(); // the points will change, clear the cache
    clearGpuSurpluses();

    auto vals = dynamic_values->extractValues(new_points);
    if (points.empty()){
        points = std::move(new_points);
        values.setValues(std::move(vals));
    }else{
        values.addValues(points, new_points, vals.data());
        points += new_points;
    }
    prepareSequence(0); // update the directional max_levels, will not shrink the number of nodes
    recomputeSurpluses(); // costly, but the only option under the circumstances
}